

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O3

int Ivy_ManCheck(Ivy_Man_t *p)

{
  Ivy_Obj_t *pObj;
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Ivy_Obj_t *pIVar4;
  int *piVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    uVar9 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar3->pArray[uVar9];
      if (pObj == (Ivy_Obj_t *)0x0) goto LAB_007da017;
      if (uVar9 != (uint)pObj->Id) {
        printf("Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n",
               (ulong)(uint)pObj->Id,uVar9 & 0xffffffff);
        return 0;
      }
      if (uVar9 == 0) {
switchD_007d9e80_caseD_1:
        if ((((pObj->pFanin0 != (Ivy_Obj_t *)0x0) &&
             (*(int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe) != 0)) ||
            ((pObj->pFanin1 != (Ivy_Obj_t *)0x0 &&
             (*(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe) != 0)))) ||
           (0x7ff < *(uint *)&pObj->field_0x8)) {
          pcVar8 = "Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n";
LAB_007da071:
          printf(pcVar8);
          return 0;
        }
      }
      else {
        uVar6 = *(uint *)&pObj->field_0x8;
        switch(uVar6 & 0xf) {
        case 1:
          goto switchD_007d9e80_caseD_1;
        case 2:
          if ((pObj->pFanin1 != (Ivy_Obj_t *)0x0) &&
             (*(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe) != 0)) {
            pcVar8 = "Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n";
            goto LAB_007da071;
          }
          break;
        default:
          piVar5 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
          if (piVar5 != (int *)0x0) {
            piVar7 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            if (piVar7 != (int *)0x0) {
              iVar1 = 0;
              iVar2 = 0;
              if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
                iVar2 = *piVar5;
              }
              if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
                iVar1 = *piVar7;
              }
              if (iVar1 <= iVar2) {
                pcVar8 = "Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n";
                goto LAB_007da071;
              }
              if ((uint)piVar7[2] >> 0xb < (uint)piVar5[2] >> 0xb) {
                piVar7 = piVar5;
              }
              if (uVar6 >> 0xb != (uint)((uVar6 & 0xf) == 6) + ((uint)piVar7[2] >> 0xb) + 1) {
                printf("Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n")
                ;
              }
              pIVar4 = Ivy_TableLookup(p,pObj);
              if (pIVar4 != pObj) {
                printf("Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n"
                       ,(ulong)(uint)pObj->Id);
              }
              if (pObj->nRefs == 0) {
                printf("Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n",(ulong)(uint)pObj->Id);
              }
              if (p->fFanout != 0) {
                iVar2 = pObj->nRefs;
                iVar1 = Ivy_ObjFanoutNum(p,pObj);
                pcVar8 = 
                "Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n"
                ;
                if (iVar2 != iVar1) goto LAB_007da00d;
              }
              break;
            }
          }
          pcVar8 = "Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n";
          goto LAB_007da071;
        case 4:
          if ((Ivy_Obj_t *)0x1 < pObj->pFanin1) {
            pcVar8 = "Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n";
            goto LAB_007da071;
          }
          if ((uVar6 & 0x600) == 0) {
            pcVar8 = "Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n";
            goto LAB_007da071;
          }
          pIVar4 = Ivy_TableLookup(p,pObj);
          pcVar8 = "Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n";
          if (pIVar4 != pObj) {
LAB_007da00d:
            printf(pcVar8,(ulong)(uint)pObj->Id);
          }
          break;
        case 7:
          if ((Ivy_Obj_t *)0x1 < pObj->pFanin1) {
            pcVar8 = "Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n";
            goto LAB_007da071;
          }
        }
      }
LAB_007da017:
      uVar9 = uVar9 + 1;
      pVVar3 = p->vObjs;
    } while ((long)uVar9 < (long)pVVar3->nSize);
  }
  iVar2 = Ivy_TableCountEntries(p);
  if (iVar2 == p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) {
    iVar2 = Ivy_ManIsAcyclic(p);
    uVar6 = (uint)(iVar2 != 0);
  }
  else {
    puts("Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.");
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ivy_ManCheck( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pObj2;
    int i;
    Ivy_ManForEachObj( p, pObj, i )
    {
        // skip deleted nodes
        if ( Ivy_ObjId(pObj) != i )
        {
            printf( "Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n", pObj->Id, i );
            return 0;
        }
        // consider the constant node and PIs
        if ( i == 0 || Ivy_ObjIsPi(pObj) )
        {
            if ( Ivy_ObjFaninId0(pObj) || Ivy_ObjFaninId1(pObj) || Ivy_ObjLevel(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsPo(pObj) )
        {
            if ( Ivy_ObjFaninId1(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsBuf(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsLatch(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            if ( Ivy_ObjInit(pObj) == IVY_INIT_NONE )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n", pObj->Id );
                return 0;
            }
            pObj2 = Ivy_TableLookup( p, pObj );
            if ( pObj2 != pObj )
                printf( "Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
            continue;
        }
        // consider the AND node
        if ( !Ivy_ObjFanin0(pObj) || !Ivy_ObjFanin1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjFaninId0(pObj) >= Ivy_ObjFaninId1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjLevel(pObj) != Ivy_ObjLevelNew(pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n", pObj->Id, Ivy_ObjLevel(pObj), Ivy_ObjLevelNew(pObj) );
        pObj2 = Ivy_TableLookup( p, pObj );
        if ( pObj2 != pObj )
            printf( "Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
        if ( Ivy_ObjRefs(pObj) == 0 )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n", pObj->Id );
        // check fanouts
        if ( p->fFanout && Ivy_ObjRefs(pObj) != Ivy_ObjFanoutNum(p, pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n", pObj->Id );
    }
    // count the number of nodes in the table
    if ( Ivy_TableCountEntries(p) != Ivy_ManAndNum(p) + Ivy_ManExorNum(p) + Ivy_ManLatchNum(p) )
    {
        printf( "Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Ivy_ManCheckFanouts(p) )
//        return 0;
    if ( !Ivy_ManIsAcyclic(p) )
        return 0;
    return 1; 
}